

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

boolean boulder_hits_pool(obj *otmp,int rx,int ry,boolean pushing)

{
  undefined1 *puVar1;
  bool bVar2;
  boolean bVar3;
  boolean bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  trap *ttmp;
  char *pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  
  if ((otmp == (obj *)0x0) || (otmp->otyp != 0x214)) {
    warning("Not a boulder?");
    return '\0';
  }
  bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if ((bVar3 != '\0') ||
     (((bVar3 = is_pool(level,rx,ry), bVar3 == '\0' && (bVar3 = is_lava(level,rx,ry), bVar3 == '\0')
       ) && (bVar3 = is_swamp(level,rx,ry), bVar3 == '\0')))) {
    return '\0';
  }
  bVar3 = is_lava(level,rx,ry);
  bVar4 = is_swamp(level,rx,ry);
  pcVar8 = waterbody_name((xchar)rx,(xchar)ry);
  cVar5 = level->locations[rx][ry].typ;
  uVar6 = mt_random();
  if (bVar4 == '\0') {
    if (bVar3 == '\0') {
      if (uVar6 % 10 == 0) goto LAB_0016b212;
      goto LAB_0016b0c4;
    }
    if (uVar6 % 10 == 0) goto LAB_0016b0c4;
LAB_0016b212:
    bVar2 = false;
LAB_0016b21f:
    if ((u._1052_1_ & 2) == 0) {
      if (pushing == '\0') {
        if ((viz_array[ry][rx] & 2U) == 0) goto LAB_0016b2d0;
LAB_0016b32e:
        pcVar9 = xname(otmp);
        pcVar9 = the(pcVar9);
        pcVar10 = "falls into";
        if (bVar2) {
          pcVar10 = "fills";
        }
        pline("There is a large splash as %s %s the %s.",pcVar9,pcVar10,pcVar8);
      }
      else {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
            if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0016b32e;
            goto LAB_0016b252;
          }
        }
        else {
LAB_0016b252:
          if (ublindf == (obj *)0x0) goto LAB_0016b2d0;
        }
        if (ublindf->oartifact == '\x1d') goto LAB_0016b32e;
LAB_0016b2d0:
        if (flags.soundok != '\0') {
          pcVar8 = " sizzling";
          if (bVar3 == '\0') {
            pcVar8 = "";
          }
          You_hear("a%s splash.",pcVar8);
        }
      }
      wake_nearto(rx,ry,0x28);
      if (bVar2) {
        bVar2 = true;
        if ((u._1052_1_ & 2) != 0) goto LAB_0016b391;
      }
      else {
        bVar2 = false;
      }
LAB_0016b3db:
      if ((bVar3 != '\0') && (iVar7 = dist2(rx,ry,(int)u.ux,(int)u.uy), iVar7 < 3)) {
        if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
            ((uVar11 = 0x2e, (u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
             ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)))) &&
           (uVar11 = 0x2e, ((byte)youmonst.mintrinsics & 1) == 0)) {
          uVar11 = 0x21;
        }
        pline("You are hit by molten lava%c",uVar11);
        iVar7 = dice(3,6);
        fire_damageu(iVar7,(monst *)0x0,"molten lava",1,0,'\0','\x01');
        goto LAB_0016b524;
      }
      if (bVar2 || flags.verbose == '\0') goto LAB_0016b524;
      if (pushing != '\0') {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
            if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0016b516;
            goto LAB_0016b469;
          }
        }
        else {
LAB_0016b469:
          if (ublindf == (obj *)0x0) goto LAB_0016b529;
        }
        if (ublindf->oartifact != '\x1d') goto LAB_0016b529;
LAB_0016b516:
        pcVar8 = "It sinks without a trace!";
        goto LAB_0016b51d;
      }
      if ((viz_array[ry][rx] & 2U) != 0) goto LAB_0016b516;
    }
    else {
      if (!bVar2) {
        bVar2 = false;
        goto LAB_0016b3db;
      }
LAB_0016b391:
      iVar7 = dist2(rx,ry,(int)u.ux,(int)u.uy);
      bVar2 = true;
      if (iVar7 != 0) goto LAB_0016b3db;
      u._1052_1_ = u._1052_1_ & 0xfd;
      doredraw();
      vision_full_recalc = '\x01';
      pcVar8 = "You find yourself on dry land again!";
LAB_0016b51d:
      pline(pcVar8);
LAB_0016b524:
      if (pushing != '\0') goto LAB_0016b529;
    }
    obfree(otmp,(obj *)0x0);
  }
  else {
LAB_0016b0c4:
    ttmp = t_at(level,rx,ry);
    if (cVar5 == '\x14') {
      puVar1 = &level->locations[rx][ry].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe3f;
      puVar1 = &level->locations[rx][ry].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 | 0xc0;
    }
    else {
      level->locations[rx][ry].typ = '\x19';
    }
    if (ttmp != (trap *)0x0) {
      delfloortrap(ttmp);
    }
    bury_objs(rx,ry);
    newsym(rx,ry);
    if (pushing == '\0') {
      bVar2 = true;
      goto LAB_0016b21f;
    }
    if (u.usteed == (monst *)0x0) {
      pcVar9 = xname(otmp);
      pcVar9 = the(pcVar9);
      pline("You push %s into the %s.",pcVar9,pcVar8);
    }
    else {
      pcVar9 = y_monnam(u.usteed);
      cVar5 = highc(*pcVar9);
      *pcVar9 = cVar5;
      pcVar10 = xname(otmp);
      pcVar10 = the(pcVar10);
      pline("%s pushes %s into the %s.",pcVar9,pcVar10,pcVar8);
    }
    if (flags.verbose != '\0') {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016b1fb;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016b1f2;
LAB_0016b29f:
        pline("Now you can cross it!");
      }
      else {
LAB_0016b1f2:
        if (ublindf != (obj *)0x0) {
LAB_0016b1fb:
          if (ublindf->oartifact == '\x1d') goto LAB_0016b29f;
        }
      }
    }
LAB_0016b529:
    delobj(otmp);
  }
  return '\x01';
}

Assistant:

boolean boulder_hits_pool(struct obj *otmp, int rx, int ry, boolean pushing)
{
	if (!otmp || otmp->otyp != BOULDER)
	    warning("Not a boulder?");
	else if (!Is_waterlevel(&u.uz) &&
		 (is_pool(level, rx,ry) || is_lava(level, rx,ry) ||
		  is_swamp(level, rx,ry))) {
	    boolean lava = is_lava(level, rx,ry), fills_up;
	    boolean swamp = is_swamp(level, rx,ry);
	    const char *what = waterbody_name(rx,ry);
	    schar ltyp = level->locations[rx][ry].typ;
	    int chance = rn2(10);		/* water: 90%; lava: 10% */
	    fills_up = swamp ? TRUE : lava ? chance == 0 : chance != 0;

	    if (fills_up) {
		struct trap *ttmp = t_at(level, rx, ry);

		if (ltyp == DRAWBRIDGE_UP) {
		    level->locations[rx][ry].drawbridgemask &= ~DB_UNDER; /* clear lava */
		    level->locations[rx][ry].drawbridgemask |= DB_FLOOR;
		} else
		    level->locations[rx][ry].typ = ROOM;

		if (ttmp) delfloortrap(ttmp);
		bury_objs(rx, ry);
		
		newsym(rx,ry);
		if (pushing) {
		    if (u.usteed) {
			char *bp = y_monnam(u.usteed);
			*bp = highc(*bp); /* bp points to a static buffer */
			pline("%s pushes %s into the %s.",
			    bp, the(xname(otmp)), what);
		    } else
			pline("You push %s into the %s.", the(xname(otmp)), what);
		    if (flags.verbose && !Blind)
			pline("Now you can cross it!");
		    /* no splashing in this case */
		}
	    }
	    if (!fills_up || !pushing) {	/* splashing occurs */
		if (!u.uinwater) {
		    if (pushing ? !Blind : cansee(rx,ry)) {
			pline("There is a large splash as %s %s the %s.",
			      the(xname(otmp)), fills_up? "fills":"falls into",
			      what);
		    } else if (flags.soundok)
			You_hear("a%s splash.", lava ? " sizzling" : "");
		    wake_nearto(rx, ry, 40);
		}

		if (fills_up && u.uinwater && distu(rx,ry) == 0) {
		    u.uinwater = 0;
		    doredraw();
		    vision_full_recalc = 1;
		    pline("You find yourself on dry land again!");
		} else if (lava && distu(rx,ry) <= 2) {
		    pline("You are hit by molten lava%c",
			  FFire_resistance ? '.' : '!');
		    fire_damageu(dice(3, 6), NULL, "molten lava", KILLED_BY,
				 0, FALSE, TRUE);
		} else if (!fills_up && flags.verbose &&
			   (pushing ? !Blind : cansee(rx,ry)))
		    pline("It sinks without a trace!");
	    }

	    /* boulder is now gone */
	    if (pushing) delobj(otmp);
	    else obfree(otmp, NULL);
	    return TRUE;
	}
	return FALSE;
}